

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void __thiscall
testing::internal::
UniversalPrinter<std::variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>>
::Visitor::operator()(Visitor *this,MouseLeftButtonDown *u)

{
  ostream *poVar1;
  string local_40 [32];
  
  poVar1 = std::operator<<(*(ostream **)this,"\'");
  GetTypeName<solitaire::events::MouseLeftButtonDown>();
  poVar1 = std::operator<<(poVar1,local_40);
  poVar1 = std::operator<<(poVar1,"(index = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")\' with value ");
  std::__cxx11::string::~string(local_40);
  RawBytesPrinter::PrintValue<solitaire::events::MouseLeftButtonDown,8ul>(u,*(ostream **)this);
  return;
}

Assistant:

void operator()(const U& u) const {
      *os << "'" << GetTypeName<U>() << "(index = " << index
          << ")' with value ";
      UniversalPrint(u, os);
    }